

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_aco.cpp
# Opt level: O3

void aco_resume(aco_t *resume_co)

{
  size_t *psVar1;
  aco_t *paVar2;
  aco_share_stack_t *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  long lVar19;
  void *pvVar20;
  aco_share_stack_t *paVar21;
  ulong uVar22;
  undefined8 *puVar23;
  void *pvVar24;
  undefined8 *puVar25;
  void *__n;
  aco_t *paVar26;
  
  if (((resume_co == (aco_t *)0x0) || (paVar26 = resume_co->main_co, paVar26 == (aco_t *)0x0)) ||
     (resume_co->is_end != '\0')) goto LAB_0011ba40;
  paVar21 = resume_co->share_stack;
  paVar2 = paVar21->owner;
  if (paVar2 != resume_co) {
    if (paVar2 != (aco_t *)0x0) {
      paVar3 = paVar2->share_stack;
      if (paVar3 != paVar21) goto LAB_0011ba40;
      pvVar24 = paVar2->reg[5];
      __n = (void *)((long)paVar3->align_retptr - (long)pvVar24);
      if ((paVar3->align_retptr < pvVar24) ||
         (pvVar24 < (void *)((long)paVar3->align_highptr - paVar3->align_limit))) goto LAB_0011ba40;
      (paVar2->save_stack).valid_sz = (size_t)__n;
      if ((void *)(paVar2->save_stack).sz < __n) {
        free((paVar2->save_stack).ptr);
        (paVar2->save_stack).ptr = (void *)0x0;
        pvVar24 = (void *)(paVar2->save_stack).sz;
        do {
          pvVar24 = (void *)((long)pvVar24 * 2);
          if (pvVar24 == (void *)0x0) {
            (paVar2->save_stack).sz = 0;
            goto LAB_0011ba40;
          }
          __n = (void *)(paVar2->save_stack).valid_sz;
        } while (pvVar24 < __n);
        (paVar2->save_stack).sz = (size_t)pvVar24;
        pvVar20 = malloc((size_t)pvVar24);
        (paVar2->save_stack).ptr = pvVar20;
        if (pvVar20 == (void *)0x0) {
          aco_resume_cold_1();
          if (pvVar24 == (void *)0x0) {
            abort();
          }
          if (*(long *)((long)pvVar24 + 0x48) != 0) {
            lVar19 = *(long *)((long)pvVar24 + 0x98);
            if (*(void **)(lVar19 + 0x30) == pvVar24) {
              *(undefined8 *)(lVar19 + 0x30) = 0;
              *(undefined8 *)(lVar19 + 0x20) = 0;
            }
            free(*(void **)((long)pvVar24 + 0x68));
          }
          free(pvVar24);
          return;
        }
      }
      if (__n != (void *)0x0) {
        puVar23 = (undefined8 *)paVar2->reg[5];
        puVar25 = (undefined8 *)(paVar2->save_stack).ptr;
        if (((((ulong)puVar23 & 0xf) == 0) && (__n < (void *)0x90)) &&
           ((((uint)__n & 0xf) == 8 && (((ulong)puVar25 & 0xf) == 0)))) {
          switch((ulong)__n >> 4) {
          case 1:
            uVar4 = puVar23[1];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            break;
          case 2:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            break;
          case 3:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            break;
          case 4:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            uVar9 = puVar23[7];
            uVar10 = puVar23[6];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            puVar25[6] = uVar10;
            puVar25[7] = uVar9;
            break;
          case 5:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            uVar9 = puVar23[7];
            uVar10 = puVar23[6];
            uVar11 = puVar23[9];
            uVar12 = puVar23[8];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            puVar25[6] = uVar10;
            puVar25[7] = uVar9;
            puVar25[8] = uVar12;
            puVar25[9] = uVar11;
            break;
          case 6:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            uVar9 = puVar23[7];
            uVar10 = puVar23[6];
            uVar11 = puVar23[9];
            uVar12 = puVar23[8];
            uVar13 = puVar23[0xb];
            uVar14 = puVar23[10];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            puVar25[6] = uVar10;
            puVar25[7] = uVar9;
            puVar25[8] = uVar12;
            puVar25[9] = uVar11;
            puVar25[10] = uVar14;
            puVar25[0xb] = uVar13;
            break;
          case 7:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            uVar9 = puVar23[7];
            uVar10 = puVar23[6];
            uVar11 = puVar23[9];
            uVar12 = puVar23[8];
            uVar13 = puVar23[0xb];
            uVar14 = puVar23[10];
            uVar15 = puVar23[0xd];
            uVar16 = puVar23[0xc];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            puVar25[6] = uVar10;
            puVar25[7] = uVar9;
            puVar25[8] = uVar12;
            puVar25[9] = uVar11;
            puVar25[10] = uVar14;
            puVar25[0xb] = uVar13;
            puVar25[0xc] = uVar16;
            puVar25[0xd] = uVar15;
            break;
          case 8:
            uVar4 = puVar23[1];
            uVar5 = puVar23[3];
            uVar6 = puVar23[2];
            uVar7 = puVar23[5];
            uVar8 = puVar23[4];
            uVar9 = puVar23[7];
            uVar10 = puVar23[6];
            uVar11 = puVar23[9];
            uVar12 = puVar23[8];
            uVar13 = puVar23[0xb];
            uVar14 = puVar23[10];
            uVar15 = puVar23[0xd];
            uVar16 = puVar23[0xc];
            uVar17 = puVar23[0xf];
            uVar18 = puVar23[0xe];
            *puVar25 = *puVar23;
            puVar25[1] = uVar4;
            puVar25[2] = uVar6;
            puVar25[3] = uVar5;
            puVar25[4] = uVar8;
            puVar25[5] = uVar7;
            puVar25[6] = uVar10;
            puVar25[7] = uVar9;
            puVar25[8] = uVar12;
            puVar25[9] = uVar11;
            puVar25[10] = uVar14;
            puVar25[0xb] = uVar13;
            puVar25[0xc] = uVar16;
            puVar25[0xd] = uVar15;
            puVar25[0xe] = uVar18;
            puVar25[0xf] = uVar17;
          }
          *(undefined8 *)((long)__n + -8 + (long)puVar25) =
               *(undefined8 *)((long)__n + -8 + (long)puVar23);
        }
        else {
          memcpy(puVar25,puVar23,(size_t)__n);
        }
        psVar1 = &(paVar2->save_stack).ct_save;
        *psVar1 = *psVar1 + 1;
        uVar22 = (paVar2->save_stack).valid_sz;
        if ((paVar2->save_stack).max_cpsz < uVar22) {
          (paVar2->save_stack).max_cpsz = uVar22;
        }
      }
      paVar21 = paVar2->share_stack;
      paVar21->owner = (aco_t *)0x0;
      paVar21->align_validsz = 0;
      paVar21 = resume_co->share_stack;
      if (paVar21->owner != (aco_t *)0x0) goto LAB_0011ba40;
    }
    uVar22 = (resume_co->save_stack).valid_sz;
    if (paVar21->align_limit - 8 < uVar22) {
LAB_0011ba40:
      abort();
    }
    if (uVar22 == 0) {
      uVar22 = 0;
    }
    else {
      puVar23 = (undefined8 *)(resume_co->save_stack).ptr;
      pvVar24 = paVar21->align_retptr;
      puVar25 = (undefined8 *)((long)pvVar24 - uVar22);
      if ((((((ulong)puVar23 & 0xf) == 0) && (uVar22 < 0x90)) && (((uint)uVar22 & 0xf) == 8)) &&
         (((ulong)puVar25 & 0xf) == 0)) {
        switch(uVar22 >> 4) {
        case 1:
          uVar4 = puVar23[1];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          break;
        case 2:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          break;
        case 3:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          break;
        case 4:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          uVar9 = puVar23[7];
          uVar10 = puVar23[6];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          puVar25[6] = uVar10;
          puVar25[7] = uVar9;
          break;
        case 5:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          uVar9 = puVar23[7];
          uVar10 = puVar23[6];
          uVar11 = puVar23[9];
          uVar12 = puVar23[8];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          puVar25[6] = uVar10;
          puVar25[7] = uVar9;
          puVar25[8] = uVar12;
          puVar25[9] = uVar11;
          break;
        case 6:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          uVar9 = puVar23[7];
          uVar10 = puVar23[6];
          uVar11 = puVar23[9];
          uVar12 = puVar23[8];
          uVar13 = puVar23[0xb];
          uVar14 = puVar23[10];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          puVar25[6] = uVar10;
          puVar25[7] = uVar9;
          puVar25[8] = uVar12;
          puVar25[9] = uVar11;
          puVar25[10] = uVar14;
          puVar25[0xb] = uVar13;
          break;
        case 7:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          uVar9 = puVar23[7];
          uVar10 = puVar23[6];
          uVar11 = puVar23[9];
          uVar12 = puVar23[8];
          uVar13 = puVar23[0xb];
          uVar14 = puVar23[10];
          uVar15 = puVar23[0xd];
          uVar16 = puVar23[0xc];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          puVar25[6] = uVar10;
          puVar25[7] = uVar9;
          puVar25[8] = uVar12;
          puVar25[9] = uVar11;
          puVar25[10] = uVar14;
          puVar25[0xb] = uVar13;
          puVar25[0xc] = uVar16;
          puVar25[0xd] = uVar15;
          break;
        case 8:
          uVar4 = puVar23[1];
          uVar5 = puVar23[3];
          uVar6 = puVar23[2];
          uVar7 = puVar23[5];
          uVar8 = puVar23[4];
          uVar9 = puVar23[7];
          uVar10 = puVar23[6];
          uVar11 = puVar23[9];
          uVar12 = puVar23[8];
          uVar13 = puVar23[0xb];
          uVar14 = puVar23[10];
          uVar15 = puVar23[0xd];
          uVar16 = puVar23[0xc];
          uVar17 = puVar23[0xf];
          uVar18 = puVar23[0xe];
          *puVar25 = *puVar23;
          puVar25[1] = uVar4;
          puVar25[2] = uVar6;
          puVar25[3] = uVar5;
          puVar25[4] = uVar8;
          puVar25[5] = uVar7;
          puVar25[6] = uVar10;
          puVar25[7] = uVar9;
          puVar25[8] = uVar12;
          puVar25[9] = uVar11;
          puVar25[10] = uVar14;
          puVar25[0xb] = uVar13;
          puVar25[0xc] = uVar16;
          puVar25[0xd] = uVar15;
          puVar25[0xe] = uVar18;
          puVar25[0xf] = uVar17;
        }
        *(undefined8 *)((long)pvVar24 + -8) = *(undefined8 *)((uVar22 - 8) + (long)puVar23);
      }
      else {
        memcpy(puVar25,puVar23,uVar22);
      }
      psVar1 = &(resume_co->save_stack).ct_restore;
      *psVar1 = *psVar1 + 1;
      uVar22 = (resume_co->save_stack).valid_sz;
      if ((resume_co->save_stack).max_cpsz < uVar22) {
        (resume_co->save_stack).max_cpsz = uVar22;
      }
    }
    paVar21 = resume_co->share_stack;
    paVar21->align_validsz = uVar22 + 8;
    paVar21->owner = resume_co;
    paVar26 = resume_co->main_co;
  }
  puVar23 = (undefined8 *)__tls_get_addr(&PTR_00135f60);
  *puVar23 = resume_co;
  acosw(paVar26,resume_co);
  *puVar23 = resume_co->main_co;
  return;
}

Assistant:

aco_attr_no_asan
void aco_resume(aco_t* resume_co){
    assert(resume_co != nullptr && resume_co->main_co != nullptr
        && resume_co->is_end == 0
    );
    if(resume_co->share_stack->owner != resume_co){
        if(resume_co->share_stack->owner != nullptr){
            aco_t* owner_co = resume_co->share_stack->owner;
            assert(owner_co->share_stack == resume_co->share_stack);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
            assert(
                (
                    (uintptr_t)(owner_co->share_stack->align_retptr)
                    >=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
                &&
                (
                    (uintptr_t)(owner_co->share_stack->align_highptr)
                    -
                    (uintptr_t)(owner_co->share_stack->align_limit)
                    <=
                    (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP])
                )
            );
            owner_co->save_stack.valid_sz =
                (uintptr_t)(owner_co->share_stack->align_retptr)
                -
                (uintptr_t)(owner_co->reg[ACO_REG_IDX_SP]);
            if(owner_co->save_stack.sz < owner_co->save_stack.valid_sz){
                eco_free(owner_co->save_stack.ptr);
                owner_co->save_stack.ptr = nullptr;
                while(1){
                    owner_co->save_stack.sz = owner_co->save_stack.sz << 1;
                    assert(owner_co->save_stack.sz > 0);
                    if(owner_co->save_stack.sz >= owner_co->save_stack.valid_sz){
                        break;
                    }
                }
                owner_co->save_stack.ptr = eco_malloc(owner_co->save_stack.sz);
                assertalloc_ptr(owner_co->save_stack.ptr);
            }
            // TODO: optimize the performance penalty of memcpy function call
            //   for very short memory span
            if(owner_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
                aco_amd64_optimized_memcpy_drop_in(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #else
                memcpy(
                    owner_co->save_stack.ptr,
                    owner_co->reg[ACO_REG_IDX_SP],
                    owner_co->save_stack.valid_sz
                );
    #endif
                owner_co->save_stack.ct_save++;
            }
            if(owner_co->save_stack.valid_sz > owner_co->save_stack.max_cpsz){
                owner_co->save_stack.max_cpsz = owner_co->save_stack.valid_sz;
            }
            owner_co->share_stack->owner = nullptr;
            owner_co->share_stack->align_validsz = 0;
#else
            #error "platform no support yet"
#endif
        }
        assert(resume_co->share_stack->owner == nullptr);
#if defined(__i386__) || defined(__x86_64__) || defined(__aarch64__)
        assert(
            resume_co->save_stack.valid_sz
            <=
            resume_co->share_stack->align_limit - sizeof(void*)
        );
        // TODO: optimize the performance penalty of memcpy function call
        //   for very short memory span
        if(resume_co->save_stack.valid_sz > 0) {
    #ifdef __x86_64__
            aco_amd64_optimized_memcpy_drop_in(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #else
            memcpy(
                (void*)(
                    (uintptr_t)(resume_co->share_stack->align_retptr)
                    -
                    resume_co->save_stack.valid_sz
                ),
                resume_co->save_stack.ptr,
                resume_co->save_stack.valid_sz
            );
    #endif
            resume_co->save_stack.ct_restore++;
        }
        if(resume_co->save_stack.valid_sz > resume_co->save_stack.max_cpsz){
            resume_co->save_stack.max_cpsz = resume_co->save_stack.valid_sz;
        }
        resume_co->share_stack->align_validsz = resume_co->save_stack.valid_sz + sizeof(void*);
        resume_co->share_stack->owner = resume_co;
#else
        #error "platform no support yet"
#endif
    }
    aco_gtls_co = resume_co;
    acosw(resume_co->main_co, resume_co);
    aco_gtls_co = resume_co->main_co;
}